

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSite::~IfcSite(IfcSite *this,void **vtt)

{
  void **vtt_local;
  IfcSite *this_local;
  
  *(void **)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject = *vtt;
  *(void **)(&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.
                                super_IfcObject + -0x18)) = vtt[0x21];
  *(void **)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x88 =
       vtt[0x22];
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x23];
  *(void **)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0xd0 =
       vtt[0x24];
  *(void **)&(this->super_IfcSpatialStructureElement).super_IfcProduct.field_0x100 = vtt[0x25];
  *(void **)&(this->super_IfcSpatialStructureElement).field_0x158 = vtt[0x26];
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe(&this->LandTitleNumber);
  STEP::Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,_3UL,_3UL>_>::
  ~Maybe(&this->RefLongitude);
  STEP::Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,_3UL,_3UL>_>::
  ~Maybe((Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,_3UL,_3UL>_> *)
         &(this->super_IfcSpatialStructureElement).field_0x168);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSite,_5UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSite,_5UL> *)
             &(this->super_IfcSpatialStructureElement).field_0x158,vtt + 0x1f);
  IfcSpatialStructureElement::~IfcSpatialStructureElement
            (&this->super_IfcSpatialStructureElement,vtt + 1);
  return;
}

Assistant:

IfcSite() : Object("IfcSite") {}